

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

void fnode_service_update(fnode_service_t *svc)

{
  _Bool _Var1;
  fnode_service_state_t fVar2;
  size_t sVar3;
  ulong uVar4;
  size_t rs_num;
  fnet_socket_t rs;
  fnet_socket_t es;
  size_t es_num;
  size_t local_50;
  timeval local_48;
  fnet_socket_t local_34;
  size_t local_30;
  
  if (svc != (fnode_service_t *)0x0) {
    fVar2 = svc->state;
    if (fVar2 == FSVC_NOTIFY_STATUS) {
      gettimeofday(&local_48,(__timezone_ptr_t)0x0);
      sVar3 = CONCAT44(local_48.tv_usec._4_4_,(undefined4)local_48.tv_usec) / 1000 +
              CONCAT44(local_48.tv_sec._4_4_,(undefined4)local_48.tv_sec) * 1000;
      fVar2 = FSVC_PROCESS_COMMANDS;
      if ((ulong)svc->keepalive <= sVar3 - svc->last_cmd_time) {
        local_48.tv_sec._0_4_ = 0x474e4950;
        local_48.tv_sec._4_4_ = (undefined4)*(undefined8 *)svc->sn;
        local_48.tv_usec._0_4_ = (undefined4)((ulong)*(undefined8 *)svc->sn >> 0x20);
        fnet_socket_sendto(svc->socket,(char *)&local_48,0xc,&svc->server);
        svc->last_cmd_time = sVar3;
      }
    }
    else if (fVar2 == FSVC_PROCESS_COMMANDS) {
      local_50 = 0;
      local_30 = 0;
      gettimeofday(&local_48,(__timezone_ptr_t)0x0);
      uVar4 = (CONCAT44(local_48.tv_usec._4_4_,(undefined4)local_48.tv_usec) / 1000 +
              CONCAT44(local_48.tv_sec._4_4_,(undefined4)local_48.tv_sec) * 1000) -
              svc->last_cmd_time;
      sVar3 = svc->keepalive - uVar4;
      if (svc->keepalive < uVar4 || sVar3 == 0) {
        sVar3 = 1;
      }
      _Var1 = fnet_socket_select(&svc->socket,1,(fnet_socket_t *)&local_48,&local_50,&local_34,
                                 &local_30,sVar3);
      if ((_Var1) && (local_50 != 0)) {
        fnode_service_recv_cmd(svc);
      }
      fVar2 = FSVC_NOTIFY_STATUS;
    }
    else {
      if (fVar2 != FSVC_INIT) {
        return;
      }
      fVar2 = fnode_service_init_handler(svc);
    }
    svc->state = fVar2;
  }
  return;
}

Assistant:

void fnode_service_update(fnode_service_t *svc)
{
    if (!svc)
        return;

    switch(svc->state)
    {
        case FSVC_INIT:
        {
            svc->state = fnode_service_init_handler(svc);
            break;
        }

        case FSVC_NOTIFY_STATUS:
        {
            svc->state = fnode_service_notify_status(svc);
            break;
        }

        case FSVC_PROCESS_COMMANDS:
        {
            svc->state = fnode_service_process_commands(svc);
            break;
        }
    }
}